

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O3

void MinorRoot(GCObjectVisitor *v)

{
  _Elt_pointer ppCVar1;
  _Elt_pointer ppSVar2;
  bool bVar3;
  _Elt_pointer ppCVar4;
  _Elt_pointer ppSVar5;
  _Elt_pointer ppTVar6;
  _Elt_pointer ppCVar7;
  _Map_pointer pppTVar8;
  _Map_pointer pppCVar9;
  _Map_pointer pppSVar10;
  _Elt_pointer ppTVar11;
  _Elt_pointer ppTVar12;
  _Elt_pointer ppCVar13;
  _Elt_pointer ppSVar14;
  
  ppTVar6 = g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  pppTVar8 = g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppTVar11 = g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  ppTVar12 = g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  ppCVar13 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppCVar1 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  pppCVar9 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppCVar4 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppSVar5 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  ppCVar7 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur !=
      g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur) {
    do {
      (*((*ppTVar12)->super_GCObject)._vptr_GCObject[2])(*ppTVar12,v);
      ppTVar12 = ppTVar12 + 1;
      if (ppTVar12 == ppTVar11) {
        ppTVar12 = pppTVar8[1];
        pppTVar8 = pppTVar8 + 1;
        ppTVar11 = ppTVar12 + 0x40;
      }
      ppCVar13 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppCVar1 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_last;
      pppCVar9 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      ppCVar4 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppSVar5 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppCVar7 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
    } while (ppTVar12 != ppTVar6);
  }
  while (g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl
         .super__Deque_impl_data._M_finish._M_cur = ppCVar7,
        ppCVar7 = g_scopeClosure.
                  super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur,
        bVar3 = ppCVar13 !=
                g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur,
        g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = ppCVar4,
        ppSVar2 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_last,
        pppSVar10 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node,
        g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = ppSVar5,
        ppSVar14 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur, bVar3) {
    (*((*ppCVar13)->super_GCObject)._vptr_GCObject[2])(*ppCVar13,v);
    ppCVar13 = ppCVar13 + 1;
    ppCVar4 = g_scopeClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppSVar5 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppCVar13 == ppCVar1) {
      ppCVar13 = pppCVar9[1];
      pppCVar9 = pppCVar9 + 1;
      ppCVar1 = ppCVar13 + 0x40;
    }
  }
  while (ppSVar14 != ppSVar5) {
    (*((*ppSVar14)->super_GCObject)._vptr_GCObject[2])(*ppSVar14,v);
    ppSVar14 = ppSVar14 + 1;
    if (ppSVar14 == ppSVar2) {
      ppSVar14 = pppSVar10[1];
      pppSVar10 = pppSVar10 + 1;
      ppSVar2 = ppSVar14 + 0x40;
    }
  }
  return;
}

Assistant:

void MinorRoot(luna::GCObjectVisitor *v)
{
    for (auto t : g_scopeTable)
        t->Accept(v);
    for (auto c : g_scopeClosure)
        c->Accept(v);
    for (auto s : g_scopeString)
        s->Accept(v);
}